

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equalAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  Image *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar6;
  uint uVar11;
  pointer pcVar12;
  Tuple2<pbrt::Point2,_int> TVar13;
  pointer pPVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  int iVar38;
  memory_resource *pmVar39;
  undefined4 extraout_var;
  allocator_type allocator;
  uint uVar40;
  long *plVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  long in_FS_OFFSET;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  float fVar68;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  float local_2b8;
  float local_268;
  size_t vb;
  undefined4 uStack_220;
  undefined1 auStack_218 [16];
  undefined1 local_208 [32];
  long *local_1e8 [2];
  long local_1d8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_1d0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1b0;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  string *local_150;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_148;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *local_140;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  Transform *local_128;
  int va;
  int iStack_11c;
  Tuple2<pbrt::Point2,_int> local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  PortalImageInfiniteLight *local_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *pcStack_a8;
  code *pcStack_a0;
  Array2D<float> local_98;
  undefined1 local_78 [16];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_68;
  ImageChannelDesc channelDesc;
  float fVar57;
  
  (this->super_LightBase).type = Infinite;
  uVar6 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar24 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar25 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar26 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar27 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar28 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar29 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar30 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar31 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar32 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar33 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar34 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar35 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar36 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar37 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar6;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar24;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar25;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar26;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar27;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar28;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar29;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar30;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar31;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar32;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar33;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar34;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar35;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar36;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar37;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  *(long *)(in_FS_OFFSET + -0x470) = *(long *)(in_FS_OFFSET + -0x470) + 1;
  *(undefined1 (*) [32])&(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y =
       ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])(this->portal).values = ZEXT432(0) << 0x40;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  pIVar1 = &this->image;
  (this->image).format = U256;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  local_128 = renderFromLight;
  pmVar39 = pstd::pmr::new_delete_resource();
  (this->image).channelNames.alloc.memoryResource = pmVar39;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  (this->image).channelNames.nStored = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->image).p8.alloc.memoryResource = alloc.memoryResource;
  auVar52 = ZEXT416(0) << 0x40;
  (this->image).p8.ptr = (uchar *)auVar52._0_8_;
  (this->image).p8.nAlloc = auVar52._8_8_;
  (this->image).p8.nStored = 0;
  (this->image).p16.alloc.memoryResource = alloc.memoryResource;
  (this->image).p16.ptr = (Half *)auVar52._0_8_;
  (this->image).p16.nAlloc = auVar52._8_8_;
  (this->image).p16.nStored = 0;
  (this->image).p32.alloc.memoryResource = alloc.memoryResource;
  (this->image).p32.ptr = (float *)auVar52._0_8_;
  (this->image).p32.nAlloc = auVar52._8_8_;
  (this->image).p32.nStored = 0;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D(&this->distribution,alloc);
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar12 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar12,pcVar12 + filename->_M_string_length);
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  vb = (size_t)auStack_218;
  local_150 = &this->filename;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_208._0_8_ = (long)local_208 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"G","");
  plVar41 = &local_1d8;
  local_1e8[0] = plVar41;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,equalAreaImage,requestedChannels);
  local_130 = &(this->image).channelNames;
  local_138 = &(this->image).p8;
  local_140 = &(this->image).p16;
  local_148 = &(this->image).p32;
  lVar44 = -0x60;
  do {
    if (plVar41 != (long *)plVar41[-2]) {
      operator_delete((long *)plVar41[-2],*plVar41 + 1);
    }
    plVar41 = plVar41 + -4;
    lVar44 = lVar44 + 0x20;
  } while (lVar44 != 0);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for PortalImageInfiniteLight doesn\'t have R, G, B channels.",
               filename);
  }
  va = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x40a,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x56f3c1,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x56f3c1,&va,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  if (channelDesc.offset.ptr == (int *)0x0) {
    channelDesc.offset.ptr = (int *)&channelDesc.offset.field_2;
  }
  if (*channelDesc.offset.ptr != 0) {
LAB_0035e14c:
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x40b,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  uVar42 = 1;
  do {
    uVar43 = uVar42;
    if (uVar43 == 3) break;
    uVar42 = uVar43 + 1;
  } while (uVar43 == (long)channelDesc.offset.ptr[uVar43]);
  if (uVar43 < 3) goto LAB_0035e14c;
  TVar13 = (equalAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (TVar13.x != TVar13.y) {
    vb = (size_t)TVar13;
    _va = TVar13;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equal area environment map."
               ,filename,(int *)&vb,&iStack_11c);
  }
  lVar44 = (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar44 != 0x30) {
    vb = (lVar44 >> 2) * -0x5555555555555555;
    ErrorExit<unsigned_long>("Expected 4 vertices for infinite light portal but given %d",&vb);
  }
  lVar44 = 0;
  do {
    pPVar14 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar44) =
         *(undefined4 *)((long)&(pPVar14->super_Tuple3<pbrt::Point3,_float>).z + lVar44);
    *(undefined8 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar44) =
         *(undefined8 *)((long)&(pPVar14->super_Tuple3<pbrt::Point3,_float>).x + lVar44);
    lVar44 = lVar44 + 0xc;
  } while (lVar44 != 0x30);
  fVar57 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y -
           (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar52 = vinsertps_avx(*(undefined1 (*) [16])
                           &(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z,
                          ZEXT416((uint)(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x
                                 ),0x10);
  auVar46 = vinsertps_avx(*(undefined1 (*) [16])
                           &(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z,
                          ZEXT416((uint)(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x
                                 ),0x10);
  auVar46 = vsubps_avx(auVar52,auVar46);
  auVar53._0_4_ = auVar46._0_4_ * auVar46._0_4_;
  auVar53._4_4_ = auVar46._4_4_ * auVar46._4_4_;
  auVar53._8_4_ = auVar46._8_4_ * auVar46._8_4_;
  auVar53._12_4_ = auVar46._12_4_ * auVar46._12_4_;
  auVar52 = vmovshdup_avx(auVar53);
  fVar51 = auVar52._0_4_ + fVar57 * fVar57 + auVar53._0_4_;
  if (fVar51 < 0.0) {
    fVar51 = sqrtf(fVar51);
  }
  else {
    auVar52 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
    fVar51 = auVar52._0_4_;
  }
  fVar66 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x -
           (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x;
  fVar68 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y -
           (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y;
  fVar15 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z -
           (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z;
  fVar49 = fVar66 * fVar66 + fVar68 * fVar68 + fVar15 * fVar15;
  if (fVar49 < 0.0) {
    fVar49 = sqrtf(fVar49);
  }
  else {
    auVar52 = vsqrtss_avx(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49));
    fVar49 = auVar52._0_4_;
  }
  local_178._4_4_ = fVar51;
  local_178._0_4_ = fVar51;
  local_178._8_4_ = fVar51;
  local_178._12_4_ = fVar51;
  uVar2 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y;
  auVar52._4_4_ = uVar7;
  auVar52._0_4_ = uVar2;
  auVar52._8_8_ = 0;
  uVar3 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x;
  uVar8 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
  auVar45._4_4_ = uVar8;
  auVar45._0_4_ = uVar3;
  auVar45._8_8_ = 0;
  auVar53 = vsubps_avx(auVar52,auVar45);
  auVar58._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar58._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar58._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar58._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar52 = vhaddps_avx(auVar58,auVar58);
  fVar16 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z -
           (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z;
  fVar50 = auVar52._0_4_ + fVar16 * fVar16;
  if (fVar50 < 0.0) {
    local_188 = auVar53;
    fVar50 = sqrtf(fVar50);
    auVar53 = local_188;
  }
  else {
    auVar52 = vsqrtss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
    fVar50 = auVar52._0_4_;
  }
  auVar59._0_4_ = fVar57 / fVar51;
  auVar59._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar52 = vdivps_avx(auVar46,local_178);
  auVar48._0_4_ = auVar53._0_4_ / fVar50;
  auVar48._4_12_ = auVar53._4_12_;
  auVar46 = vmovshdup_avx(auVar53);
  fVar65 = auVar46._0_4_ / fVar50;
  local_178 = ZEXT416((uint)(fVar16 / fVar50));
  fVar57 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x -
           (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  uVar4 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
  uVar9 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z;
  auVar46._4_4_ = uVar9;
  auVar46._0_4_ = uVar4;
  auVar46._8_8_ = 0;
  uVar5 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  uVar10 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar60._4_4_ = uVar10;
  auVar60._0_4_ = uVar5;
  auVar60._8_8_ = 0;
  auVar53 = vsubps_avx(auVar46,auVar60);
  auVar47._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar47._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar47._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar47._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar46 = vmovshdup_avx(auVar47);
  fVar51 = fVar57 * fVar57 + auVar47._0_4_ + auVar46._0_4_;
  local_188._0_4_ = fVar65;
  if (fVar51 < 0.0) {
    local_168 = auVar53;
    fVar51 = sqrtf(fVar51);
    auVar46 = ZEXT416((uint)auVar48._0_4_);
    auVar53 = local_168;
    fVar65 = (float)local_188._0_4_;
  }
  else {
    auVar46 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
    fVar51 = auVar46._0_4_;
    auVar46 = auVar48;
  }
  fVar66 = fVar66 / fVar49;
  fVar68 = fVar68 / fVar49;
  auVar67._0_4_ = fVar15 / fVar49;
  auVar67._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar57 = fVar57 / fVar51;
  auVar60 = ZEXT416((uint)fVar57);
  auVar54._4_4_ = fVar51;
  auVar54._0_4_ = fVar51;
  auVar54._8_4_ = fVar51;
  auVar54._12_4_ = fVar51;
  auVar53 = vdivps_avx(auVar53,auVar54);
  auVar58 = vmovshdup_avx(auVar52);
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * auVar59._0_4_)),auVar58,auVar46);
  auVar45 = vfmadd231ss_fma(auVar45,auVar52,local_178);
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar45 = vandps_avx512vl(ZEXT416((uint)(auVar45._0_4_ + -1.0)),auVar17);
  fVar51 = auVar53._0_4_;
  if (0.001 < auVar45._0_4_) {
LAB_0035da4f:
    local_168._0_4_ = fVar68;
    _uStack_220 = 0;
    auStack_218._0_8_ = auStack_218._0_8_ & 0xffffffffffffff00;
    vb = (size_t)auStack_218;
    detail::stringPrintfRecursive
              ((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral");
    Error((FileLoc *)0x0,(char *)vb);
    if ((undefined1 *)vb != auStack_218) {
      operator_delete((void *)vb,auStack_218._0_8_ + 1);
    }
    auVar46 = ZEXT416((uint)auVar48._0_4_);
    fVar68 = (float)local_168._0_4_;
    fVar65 = (float)local_188._0_4_;
  }
  else {
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar51)),ZEXT416((uint)fVar66),
                              ZEXT416((uint)fVar57));
    auVar45 = vmovshdup_avx(auVar53);
    auVar45 = vfmadd213ss_fma(auVar45,auVar67,auVar47);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar45 = vandps_avx512vl(ZEXT416((uint)(auVar45._0_4_ + -1.0)),auVar18);
    if (0.001 < auVar45._0_4_) goto LAB_0035da4f;
  }
  local_268 = auVar58._0_4_;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * auVar59._0_4_)),ZEXT416((uint)fVar66),
                            ZEXT416((uint)local_268));
  local_2b8 = auVar52._0_4_;
  auVar45 = vfmadd231ss_fma(auVar45,auVar67,ZEXT416((uint)local_2b8));
  auVar19._8_4_ = 0x7fffffff;
  auVar19._0_8_ = 0x7fffffff7fffffff;
  auVar19._12_4_ = 0x7fffffff;
  auVar45 = vandps_avx512vl(auVar45,auVar19);
  if (auVar45._0_4_ <= 0.001) {
    auVar45 = vfmadd213ss_fma(ZEXT416((uint)fVar66),auVar46,ZEXT416((uint)(fVar68 * fVar65)));
    auVar45 = vfmadd213ss_fma(auVar67,local_178,auVar45);
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar45 = vandps_avx512vl(auVar45,auVar20);
    if (auVar45._0_4_ <= 0.001) {
      auVar45 = vfmadd132ss_fma(auVar46,ZEXT416((uint)(fVar65 * fVar51)),ZEXT416((uint)fVar57));
      auVar46 = vmovshdup_avx(auVar53);
      auVar45 = vfmadd213ss_fma(local_178,auVar46,auVar45);
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar45 = vandps_avx512vl(auVar45,auVar21);
      if (auVar45._0_4_ <= 0.001) {
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar59._0_4_)),auVar58,
                                  ZEXT416((uint)fVar57));
        auVar46 = vfmadd231ss_fma(auVar45,auVar46,ZEXT416((uint)local_2b8));
        auVar22._8_4_ = 0x7fffffff;
        auVar22._0_8_ = 0x7fffffff7fffffff;
        auVar22._12_4_ = 0x7fffffff;
        auVar46 = vandps_avx512vl(auVar46,auVar22);
        if (auVar46._0_4_ <= 0.001) goto LAB_0035dbf2;
      }
    }
  }
  _uStack_220 = 0;
  auStack_218._0_8_ = auStack_218._0_8_ & 0xffffffffffffff00;
  vb = (size_t)auStack_218;
  detail::stringPrintfRecursive((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral")
  ;
  Error((FileLoc *)0x0,(char *)vb);
  if ((undefined1 *)vb != auStack_218) {
    operator_delete((void *)vb,auStack_218._0_8_ + 1);
  }
LAB_0035dbf2:
  auVar45 = vshufps_avx(auVar52,auVar52,0xe1);
  auVar47 = vpermt2ps_avx512vl(auVar52,_DAT_005670a0,auVar59);
  auVar46 = vinsertps_avx(auVar60,auVar53,0x1c);
  auVar61._4_12_ = auVar45._4_12_;
  auVar61._0_4_ = auVar59._0_4_;
  auVar48 = vpermi2ps_avx512vl(_DAT_005670a0,auVar53,auVar60);
  auVar64._0_4_ = auVar59._0_4_ * auVar48._0_4_;
  auVar64._4_4_ = auVar45._4_4_ * auVar48._4_4_;
  auVar64._8_4_ = auVar45._8_4_ * auVar48._8_4_;
  auVar64._12_4_ = auVar45._12_4_ * auVar48._12_4_;
  auVar52 = vfmsub213ps_fma(auVar52,auVar53,auVar64);
  auVar45 = vfnmadd213ps_fma(auVar48,auVar61,auVar64);
  auVar55._0_4_ = auVar52._0_4_ + auVar45._0_4_;
  auVar55._4_4_ = auVar52._4_4_ + auVar45._4_4_;
  auVar55._8_4_ = auVar52._8_4_ + auVar45._8_4_;
  auVar55._12_4_ = auVar52._12_4_ + auVar45._12_4_;
  auVar52 = vfmsub213ss_fma(auVar59,auVar60,ZEXT416((uint)(fVar51 * local_268)));
  auVar58 = vfnmadd213ss_fma(auVar58,auVar53,ZEXT416((uint)(fVar51 * local_268)));
  uVar6 = vmovlps_avx(auVar46);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  fVar51 = (float)vextractps_avx(auVar53,1);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = fVar51;
  uVar6 = vmovlps_avx(auVar47);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = local_2b8;
  uVar6 = vmovlps_avx(auVar55);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = auVar52._0_4_ + auVar58._0_4_;
  TVar13 = (equalAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  _va = (Tuple2<pbrt::Point2,_int>)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"R","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"G","");
  plVar41 = local_d0;
  local_e0[0] = plVar41;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"B","");
  local_68.bits =
       (equalAreaImage->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&va;
  Image::Image((Image *)&vb,Float,(Point2i)TVar13,channels,(ColorEncodingHandle *)&local_68,alloc);
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = uStack_220;
  pIVar1->format = (undefined4)vb;
  (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.x = vb._4_4_;
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(local_130,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_218);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = local_208._16_8_;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (local_138,
             (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             (local_208 + 0x18));
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (local_140,&local_1d0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_148,&local_1b0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_1b0);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_1d0);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             (local_208 + 0x18));
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_218);
  lVar44 = -0x60;
  do {
    if (plVar41 != (long *)plVar41[-2]) {
      operator_delete((long *)plVar41[-2],*plVar41 + 1);
    }
    plVar41 = plVar41 + -4;
    lVar44 = lVar44 + 0x20;
  } while (lVar44 != 0);
  TVar13 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_b8 = (undefined8 *)0x0;
  uStack_b0 = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8 = (undefined8 *)operator_new(0x18);
  *local_b8 = this;
  local_b8[1] = local_128;
  local_b8[2] = equalAreaImage;
  vb = (size_t)&local_b8;
  pcStack_a0 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp:1065:42)>
               ::_M_invoke;
  pcStack_a8 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp:1065:42)>
               ::_M_manager;
  _uStack_220 = 0;
  auStack_218._8_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
       ::_M_invoke;
  auStack_218._0_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:166:29)>
       ::_M_manager;
  ParallelFor(0,(long)TVar13 >> 0x20,(function<void_(long,_long)> *)&vb);
  if ((code *)auStack_218._0_8_ != (code *)0x0) {
    (*(code *)auStack_218._0_8_)(&vb,&vb,3);
  }
  if (pcStack_a8 != (code *)0x0) {
    (*pcStack_a8)(&local_b8,&local_b8,3);
  }
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = 0x3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  local_78 = vmovlhps_avx(ZEXT816(0) << 0x40,auVar62);
  local_110._M_allocated_capacity = (size_type)pstd::pmr::new_delete_resource();
  uVar40 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x;
  uVar11 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  local_110._8_8_ = (float *)0x0;
  uVar42 = 0;
  if (0 < (int)uVar40) {
    uVar42 = (ulong)uVar40;
  }
  uVar43 = 0;
  if (0 < (int)uVar11) {
    uVar43 = (ulong)uVar11;
  }
  local_118 = (Tuple2<pbrt::Point2,_int>)(uVar42 | uVar43 << 0x20);
  _va = (Tuple2<pbrt::Point2,_int>)
        CONCAT44((int)uVar11 >> 0x1f & uVar11,(int)uVar40 >> 0x1f & uVar40);
  uVar23 = -uVar40;
  if (0 < (int)uVar40) {
    uVar23 = uVar40;
  }
  uVar40 = -uVar11;
  if (0 < (int)uVar11) {
    uVar40 = uVar11;
  }
  uVar40 = uVar40 * uVar23;
  local_c0 = this;
  if (uVar40 != 0) {
    iVar38 = (*((memory_resource *)local_110._M_allocated_capacity)->_vptr_memory_resource[2])
                       (local_110._M_allocated_capacity,(ulong)uVar40 * 4,4);
    local_110._8_8_ = CONCAT44(extraout_var,iVar38);
  }
  if (0 < (int)uVar40) {
    memset((void *)local_110._8_8_,0,(ulong)uVar40 << 2);
  }
  iVar38 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  vb = 0;
  _uStack_220 = 0;
  auStack_218._0_8_ = 0;
  auStack_218._8_8_ = 0;
  vb = (size_t)operator_new(0x20);
  *(Image **)vb = pIVar1;
  *(undefined1 **)(vb + 8) = local_78;
  *(int **)(vb + 0x10) = &va;
  *(PortalImageInfiniteLight ***)(vb + 0x18) = &local_c0;
  auStack_218._8_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h:445:35)>
       ::_M_invoke;
  auStack_218._0_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h:445:35)>
       ::_M_manager;
  ParallelFor(0,(long)iVar38,(function<void_(long,_long)> *)&vb);
  if ((code *)auStack_218._0_8_ != (code *)0x0) {
    (*(code *)auStack_218._0_8_)(&vb,&vb,3);
  }
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  auVar56._8_8_ = 0;
  auVar56._0_4_ = local_118.x;
  auVar56._4_4_ = local_118.y;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = _va;
  auVar52 = vpsubd_avx(auVar56,auVar63);
  Array2D<float>::Array2D<float_const*,void>
            (&local_98,(float *)local_110._8_8_,
             (float *)(local_110._8_8_ + (long)(auVar52._4_4_ * auVar52._0_4_) * 4),auVar52._0_4_,
             auVar52._4_4_,allocator);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)&vb,&local_98,alloc);
  Array2D<double>::operator=((Array2D<double> *)&this->distribution,(Array2D<double> *)&vb);
  Array2D<float>::operator=(&(this->distribution).func,(Array2D<float> *)local_208);
  Array2D<float>::~Array2D((Array2D<float> *)local_208);
  Array2D<double>::~Array2D((Array2D<double> *)&vb);
  Array2D<float>::~Array2D(&local_98);
  Array2D<float>::~Array2D((Array2D<float> *)&va);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&channelDesc.offset)
  ;
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equalAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    ImageChannelDesc channelDesc = equalAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equalAreaImage.Resolution().x != equalAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equal area environment map.",
                  filename, equalAreaImage.Resolution().x, equalAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // PortalImageInfiniteLight constructor conclusion
    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p03, p01);

    // Resample environment map into rectified image
    image = Image(PixelFormat::Float, equalAreaImage.Resolution(), {"R", "G", "B"},
                  equalAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // Resample _equalAreaImage_ to compute rectified image pixel $(x,y)$
            // Find $(u,v)$ coordinates in equal-area image for pixel
            Point2f uv((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);
            Vector3f w = RenderFromImage(uv);
            w = Normalize(renderFromLight.ApplyInverse(w));
            Point2f uvEqui = EqualAreaSphereToSquare(w);

            for (int c = 0; c < 3; ++c) {
                Float v =
                    equalAreaImage.BilerpChannel(uvEqui, c, WrapMode::OctahedralSphere);
                image.SetChannel({x, y}, c, v);
            }
        }
    });

    // Initialize sampling distribution for portal image infinite light
    auto duv_dw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duv_dw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}